

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O1

void mmdupd_(int *ehead,int *neqns,int *xadj,int *adjncy,int *delta,int *mdeg,int *dhead,int *dforw,
            int *dbakw,int *qsize,int *llist,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint local_64;
  uint local_60;
  int local_50;
  uint local_4c;
  uint local_3c;
  uint local_38;
  int local_34;
  
  local_4c = *ehead;
  if ((int)local_4c < 1) {
    return;
  }
  iVar1 = *delta;
  iVar2 = *mdeg;
LAB_0014397a:
  local_50 = *tag + iVar1 + iVar2;
  if (*maxint <= local_50) {
    *tag = 1;
    uVar11 = *neqns;
    if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        if (marker[uVar12] < *maxint) {
          marker[uVar12] = 0;
        }
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    local_50 = *tag + iVar1 + iVar2;
  }
  uVar12 = (ulong)local_4c;
  iVar9 = xadj[uVar12 - 1];
  iVar14 = xadj[uVar12];
  local_34 = 0;
  local_3c = 0;
  uVar11 = 0;
  if (iVar9 < iVar14) {
    local_34 = 0;
    local_3c = 0;
    uVar11 = 0;
    iVar15 = 0;
    local_64 = 0;
    local_60 = 0;
    do {
      lVar16 = (long)iVar9;
      local_38 = local_64;
      uVar8 = local_60;
      while( true ) {
        uVar3 = adjncy[lVar16 + -1];
        lVar10 = (long)(int)uVar3;
        if (lVar10 < 0) break;
        if (uVar3 == 0) goto LAB_00143b1a;
        if (qsize[lVar10 + -1] != 0) {
          local_34 = iVar15 + qsize[lVar10 + -1];
          marker[lVar10 + -1] = local_50;
          iVar15 = local_34;
          if (dbakw[lVar10 + -1] == 0) {
            uVar17 = local_64;
            uVar5 = local_60;
            uVar6 = uVar3;
            uVar7 = uVar3;
            if (dforw[lVar10 + -1] != 2) {
              uVar17 = uVar3;
              local_38 = uVar3;
              local_3c = uVar3;
              uVar5 = local_64;
              uVar3 = uVar11;
              uVar6 = uVar8;
              uVar7 = local_60;
            }
            local_60 = uVar7;
            uVar8 = uVar6;
            uVar11 = uVar3;
            llist[lVar10 + -1] = uVar5;
            local_64 = uVar17;
          }
        }
        lVar16 = lVar16 + 1;
        if (iVar14 <= lVar16) goto LAB_00143b1a;
      }
      iVar9 = xadj[(ulong)-uVar3 - 1];
      iVar14 = xadj[-uVar3];
      local_64 = local_38;
      local_60 = uVar8;
    } while (iVar9 < iVar14);
  }
LAB_00143b1a:
  bVar13 = true;
LAB_00143b1d:
  iVar9 = local_34;
  if ((int)uVar11 < 1) {
    bVar13 = false;
    uVar11 = local_3c;
    goto LAB_00143c68;
  }
  if (dbakw[(ulong)uVar11 - 1] != 0) goto LAB_00143d70;
  *tag = *tag + 1;
  uVar8 = adjncy[(long)xadj[(ulong)uVar11 - 1] + -1];
  if (uVar8 == local_4c) {
    uVar8 = adjncy[xadj[(ulong)uVar11 - 1]];
  }
  lVar16 = (long)(int)uVar8;
  if (dforw[lVar16 + -1] < 0) {
    iVar14 = xadj[lVar16 + -1];
    iVar15 = xadj[lVar16];
    if (iVar14 < iVar15) {
LAB_00143b8c:
      lVar16 = (long)iVar14;
      do {
        uVar8 = adjncy[lVar16 + -1];
        uVar18 = (ulong)uVar8;
        if (uVar8 != uVar11) {
          if ((int)uVar8 < 0) goto LAB_00143c3e;
          if (uVar18 == 0) break;
          if (qsize[uVar18 - 1] != 0) {
            if (marker[uVar18 - 1] < *tag) {
              marker[uVar18 - 1] = *tag;
              iVar9 = iVar9 + qsize[uVar18 - 1];
            }
            else if (dbakw[uVar18 - 1] == 0) {
              if (dforw[uVar18 - 1] == 2) {
                qsize[(ulong)uVar11 - 1] = qsize[(ulong)uVar11 - 1] + qsize[uVar18 - 1];
                qsize[uVar18 - 1] = 0;
                marker[uVar18 - 1] = *maxint;
                dforw[uVar18 - 1] = -uVar11;
              }
              dbakw[uVar18 - 1] = -*maxint;
            }
          }
        }
        lVar16 = lVar16 + 1;
        if (iVar15 <= lVar16) break;
      } while( true );
    }
  }
  else {
    iVar9 = qsize[lVar16 + -1] + local_34;
  }
LAB_00143d23:
  do {
    do {
      lVar16 = (long)iVar9 - (long)qsize[(ulong)uVar11 - 1];
      iVar14 = (uint)lVar16 + 1;
      iVar9 = dhead[lVar16];
      dforw[(ulong)uVar11 - 1] = iVar9;
      dbakw[(ulong)uVar11 - 1] = ~(uint)lVar16;
      if (0 < (long)iVar9) {
        dbakw[(long)iVar9 + -1] = uVar11;
      }
      dhead[lVar16] = uVar11;
      if (iVar14 < *mdeg) {
        *mdeg = iVar14;
      }
LAB_00143d70:
      do {
        uVar11 = llist[(long)(int)uVar11 + -1];
        if (bVar13) goto LAB_00143b1d;
LAB_00143c68:
        if ((int)uVar11 < 1) {
          *tag = local_50;
          local_4c = llist[uVar12 - 1];
          if ((int)local_4c < 1) {
            return;
          }
          goto LAB_0014397a;
        }
      } while (dbakw[(ulong)uVar11 - 1] != 0);
      *tag = *tag + 1;
      iVar14 = xadj[uVar11];
      iVar9 = local_34;
    } while (iVar14 <= xadj[(ulong)uVar11 - 1]);
    lVar16 = (long)xadj[(ulong)uVar11 - 1];
    do {
      uVar18 = (ulong)adjncy[lVar16 + -1];
      if (uVar18 == 0) break;
      if (marker[uVar18 - 1] < *tag) {
        marker[uVar18 - 1] = *tag;
        if (dforw[uVar18 - 1] < 0) {
          while( true ) {
            iVar15 = xadj[uVar18];
            if (iVar15 <= xadj[uVar18 - 1]) break;
            lVar10 = (long)xadj[uVar18 - 1];
            while( true ) {
              iVar4 = adjncy[lVar10 + -1];
              lVar19 = (long)iVar4;
              if (lVar19 < 0) break;
              if (iVar4 == 0) goto LAB_00143d0a;
              if (marker[lVar19 + -1] < *tag) {
                marker[lVar19 + -1] = *tag;
                iVar9 = iVar9 + qsize[lVar19 + -1];
              }
              lVar10 = lVar10 + 1;
              if (iVar15 <= lVar10) goto LAB_00143d0a;
            }
            uVar18 = (ulong)(uint)-iVar4;
          }
        }
        else {
          iVar9 = iVar9 + qsize[uVar18 - 1];
        }
      }
LAB_00143d0a:
      lVar16 = lVar16 + 1;
    } while (iVar14 != (int)lVar16);
  } while( true );
LAB_00143c3e:
  iVar14 = xadj[(ulong)-uVar8 - 1];
  iVar15 = xadj[-uVar8];
  if (iVar15 <= iVar14) goto LAB_00143d23;
  goto LAB_00143b8c;
}

Assistant:

void mmdupd_(int* ehead, int* neqns, int* xadj, int* adjncy, int* delta,
            int* mdeg, int* dhead, int* dforw, int* dbakw, int* qsize,
            int* llist, int* marker, int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt,
            istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
        return;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
        goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
        if (marker[i] < *maxint) {
            marker[i] = 0;
        }
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        enode = adjncy[i];
        link = -enode;
        if (enode < 0) {
            goto L400;
        } else if (enode == 0) {
            goto L800;
        } else {
            goto L500;
        }

L500:
        if (qsize[enode] == 0) {
            goto L700;
        }
        deg0 += qsize[enode];
        marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
        if (dbakw[enode] != 0) {
            goto L700;
        }
/*                            ---------------------------------------
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS.
*/
/*                            ---------------------------------------
*/
        if (dforw[enode] == 2) {
            goto L600;
        }
        llist[enode] = qxhead;
        qxhead = enode;
        goto L700;
L600:
        llist[enode] = q2head;
        q2head = enode;
L700:
        ;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
        goto L1500;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
        nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
        goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        node = adjncy[i];
        link = -node;
        if (node == enode) {
            goto L1400;
        }
        if (node < 0) {
            goto L1000;
        } else if (node == 0) {
            goto L2100;
        } else {
            goto L1100;
        }

L1100:
        if (qsize[node] == 0) {
            goto L1400;
        }
        if (marker[node] >= *tag) {
            goto L1200;
        }
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
        marker[node] = *tag;
        deg += qsize[node];
        goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
        if (dbakw[node] != 0) {
            goto L1400;
        }
        if (dforw[node] != 2) {
            goto L1300;
        }
        qsize[enode] += qsize[node];
        qsize[node] = 0;
        marker[node] = *maxint;
        dforw[node] = -enode;
        dbakw[node] = -(*maxint);
        goto L1400;
L1300:
/*                            --------------------------------------
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE.
*/
/*                            --------------------------------------
*/
        if (dbakw[node] == 0) {
            dbakw[node] = -(*maxint);
        }
L1400:
        ;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
        goto L2300;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L2100;
        }
        if (marker[nabor] >= *tag) {
            goto L2000;
        }
        marker[nabor] = *tag;
        link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
        if (dforw[nabor] < 0) {
            goto L1700;
        }
        deg += qsize[nabor];
        goto L2000;
L1700:
/*                                    -------------------------------
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED
*/
/*                                    NODES IN THIS ELEMENT INTO THE
*/
/*                                    DEGREE COUNT. */
/*                                    -------------------------------
*/
        jstrt = xadj[link];
        jstop = xadj[link + 1] - 1;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            node = adjncy[j];
            link = -node;
            if (node < 0) {
                goto L1700;
            } else if (node == 0) {
                goto L2000;
            } else {
                goto L1800;
            }

L1800:
            if (marker[node] >= *tag) {
                goto L1900;
            }
            marker[node] = *tag;
            deg += qsize[node];
L1900:
            ;
        }
L2000:
        ;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
        dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
        *mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
        goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}